

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlCatalogPtr xmlLoadACatalog(char *filename)

{
  byte bVar1;
  int iVar2;
  byte *value;
  byte *pbVar3;
  xmlCatalogPtr catal;
  xmlCatalogEntryPtr pxVar4;
  
  value = xmlLoadFileContent(filename);
  pbVar3 = value;
  if (value == (byte *)0x0) {
    return (xmlCatalogPtr)0x0;
  }
  do {
    bVar1 = *pbVar3;
    if ((bVar1 == 0) || (bVar1 == 0x2d)) break;
    if (bVar1 == 0x3c) {
      catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
      if (catal == (xmlCatalogPtr)0x0) goto LAB_001609f2;
      pxVar4 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)filename
                                  ,xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
      catal->xml = pxVar4;
      goto LAB_001609f5;
    }
    pbVar3 = pbVar3 + 1;
  } while ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6);
  catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
  if (catal != (xmlCatalogPtr)0x0) {
    iVar2 = xmlParseSGMLCatalog(catal,value,filename,0);
    if (-1 < iVar2) goto LAB_001609f5;
    xmlFreeCatalog(catal);
  }
LAB_001609f2:
  catal = (xmlCatalogPtr)0x0;
LAB_001609f5:
  (*xmlFree)(value);
  return catal;
}

Assistant:

xmlCatalogPtr
xmlLoadACatalog(const char *filename)
{
    xmlChar *content;
    xmlChar *first;
    xmlCatalogPtr catal;
    int ret;

    content = xmlLoadFileContent(filename);
    if (content == NULL)
        return(NULL);


    first = content;

    while ((*first != 0) && (*first != '-') && (*first != '<') &&
	   (!(((*first >= 'A') && (*first <= 'Z')) ||
	      ((*first >= 'a') && (*first <= 'z')))))
	first++;

    if (*first != '<') {
	catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        ret = xmlParseSGMLCatalog(catal, content, filename, 0);
	if (ret < 0) {
	    xmlFreeCatalog(catal);
	    xmlFree(content);
	    return(NULL);
	}
    } else {
	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        catal->xml = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
		       NULL, BAD_CAST filename, xmlCatalogDefaultPrefer, NULL);
    }
    xmlFree(content);
    return (catal);
}